

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

void trial::protocol::serialization::
     save_overloader<trial::protocol::bintoken::oarchive,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
     ::save(oarchive *ar,variable *data,uint protocol_version)

{
  basic_variable<std::allocator<char>_> *this;
  variable *pvVar1;
  bool bVar2;
  value vVar3;
  error *this_00;
  const_reference pbVar4;
  undefined1 local_1d8 [8];
  pair<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  value;
  basic_variable<std::allocator<char>_> val;
  basic_variable<std::allocator<char>_> key;
  const_iterator local_110;
  undefined1 local_f8 [8];
  const_iterator it;
  basic_variable<std::allocator<char>_> *item;
  const_iterator __end4;
  const_iterator __begin4;
  variable *__range4;
  type local_88;
  type_conflict9 local_68;
  type_conflict9 local_60;
  type_conflict8 local_54;
  type_conflict7 local_50;
  type_conflict6 local_48;
  type_conflict7 local_40;
  type_conflict6 local_38;
  type_conflict5 local_2c;
  type_conflict4 local_28;
  type_conflict3 local_24;
  type_conflict2 local_22;
  type_conflict1 local_1f;
  type_conflict local_1e;
  bool local_1d;
  uint local_1c;
  variable *pvStack_18;
  uint protocol_version_local;
  variable *data_local;
  oarchive *ar_local;
  
  local_1c = protocol_version;
  pvStack_18 = data;
  data_local = (variable *)ar;
  vVar3 = dynamic::basic_variable<std::allocator<char>_>::code(data);
  pvVar1 = data_local;
  switch(vVar3) {
  case null:
    bintoken::oarchive::save<trial::protocol::bintoken::token::null>((oarchive *)data_local);
    break;
  case boolean:
    local_1d = dynamic::basic_variable<std::allocator<char>_>::value<bool>(pvStack_18);
    bintoken::oarchive::save<bool>((oarchive *)pvVar1,&local_1d);
    break;
  case signed_char:
    local_1e = dynamic::basic_variable<std::allocator<char>_>::value<signed_char>(pvStack_18);
    bintoken::oarchive::save<signed_char>((oarchive *)pvVar1,&local_1e);
    break;
  case unsigned_char:
    local_1f = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_char>(pvStack_18);
    bintoken::oarchive::save<unsigned_char>((oarchive *)pvVar1,&local_1f);
    break;
  case signed_short_integer:
    local_22 = dynamic::basic_variable<std::allocator<char>_>::value<short>(pvStack_18);
    bintoken::oarchive::save<short>((oarchive *)pvVar1,&local_22);
    break;
  case unsigned_short_integer:
    local_24 = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_short>(pvStack_18);
    bintoken::oarchive::save<unsigned_short>((oarchive *)pvVar1,&local_24);
    break;
  case signed_integer:
    local_28 = dynamic::basic_variable<std::allocator<char>_>::value<int>(pvStack_18);
    bintoken::oarchive::save<int>((oarchive *)pvVar1,&local_28);
    break;
  case unsigned_integer:
    local_2c = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_int>(pvStack_18);
    bintoken::oarchive::save<unsigned_int>((oarchive *)pvVar1,&local_2c);
    break;
  case signed_long_integer:
    local_38 = dynamic::basic_variable<std::allocator<char>_>::value<long>(pvStack_18);
    bintoken::oarchive::save<long>((oarchive *)pvVar1,&local_38);
    break;
  case unsigned_long_integer:
    local_40 = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_long>(pvStack_18);
    bintoken::oarchive::save<unsigned_long>((oarchive *)pvVar1,&local_40);
    break;
  case signed_long_long_integer:
    local_48 = dynamic::basic_variable<std::allocator<char>_>::value<long_long>(pvStack_18);
    bintoken::oarchive::save<long_long>((oarchive *)pvVar1,&local_48);
    break;
  case unsigned_long_long_integer:
    local_50 = dynamic::basic_variable<std::allocator<char>_>::value<unsigned_long_long>(pvStack_18)
    ;
    bintoken::oarchive::save<unsigned_long_long>((oarchive *)pvVar1,&local_50);
    break;
  case float_number:
    local_54 = dynamic::basic_variable<std::allocator<char>_>::value<float>(pvStack_18);
    bintoken::oarchive::save<float>((oarchive *)pvVar1,&local_54);
    break;
  case double_number:
    local_60 = dynamic::basic_variable<std::allocator<char>_>::value<double>(pvStack_18);
    bintoken::oarchive::save<double>((oarchive *)pvVar1,&local_60);
    break;
  case long_double_number:
    local_68 = dynamic::basic_variable<std::allocator<char>_>::value<double>(pvStack_18);
    bintoken::oarchive::save<double>((oarchive *)pvVar1,&local_68);
    break;
  case string:
    dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::string>
              (&local_88,pvStack_18);
    bintoken::oarchive::save<std::__cxx11::string>((oarchive *)pvVar1,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    break;
  case wstring:
  case u16string:
  case u32string:
    this_00 = (error *)__cxa_allocate_exception(0x20);
    bintoken::error::error(this_00,incompatible_type);
    __cxa_throw(this_00,&bintoken::error::typeinfo,bintoken::error::~error);
  case array:
    bintoken::oarchive::save<trial::protocol::bintoken::token::begin_array>((oarchive *)data_local);
    pvVar1 = data_local;
    __range4 = (variable *)dynamic::basic_variable<std::allocator<char>_>::size(pvStack_18);
    bintoken::oarchive::save<unsigned_long>((oarchive *)pvVar1,(unsigned_long *)&__range4);
    this = pvStack_18;
    dynamic::basic_variable<std::allocator<char>_>::begin
              ((const_iterator *)
               &__end4.
                super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                .current.current,pvStack_18);
    dynamic::basic_variable<std::allocator<char>_>::end((const_iterator *)&item,this);
    while (bVar2 = dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                             ((const_iterator *)
                              &__end4.
                               super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                               .current.current,(const_iterator *)&item), bVar2) {
      it.
      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      .current._8_8_ =
           dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator*
                     ((const_iterator *)
                      &__end4.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current);
      bintoken::oarchive::save_override<trial::dynamic::basic_variable<std::allocator<char>>>
                ((oarchive *)data_local,
                 (basic_variable<std::allocator<char>_> *)
                 it.
                 super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                 .current._8_8_,(ulong)local_1c);
      dynamic::basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::operator++((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    *)&__end4.
                       super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                       .current.current);
    }
    dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
              ((const_iterator *)&item);
    dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
              ((const_iterator *)
               &__end4.
                super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                .current.current);
    bintoken::oarchive::save<trial::protocol::bintoken::token::end_array>((oarchive *)data_local);
    break;
  case map:
    bintoken::oarchive::save<trial::protocol::bintoken::token::begin_assoc_array>
              ((oarchive *)data_local);
    bintoken::oarchive::save<trial::protocol::bintoken::token::null>((oarchive *)data_local);
    dynamic::basic_variable<std::allocator<char>_>::begin((const_iterator *)local_f8,pvStack_18);
    while( true ) {
      dynamic::basic_variable<std::allocator<char>_>::end(&local_110,pvStack_18);
      bVar2 = dynamic::basic_variable<std::allocator<char>_>::const_iterator::operator!=
                        ((const_iterator *)local_f8,&local_110);
      dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_110);
      if (!bVar2) break;
      pbVar4 = dynamic::basic_variable<std::allocator<char>_>::const_iterator::key
                         ((const_iterator *)local_f8);
      dynamic::basic_variable<std::allocator<char>_>::basic_variable
                ((basic_variable<std::allocator<char>_> *)&val.storage.field_0x28,pbVar4);
      pbVar4 = dynamic::basic_variable<std::allocator<char>_>::const_iterator::value
                         ((const_iterator *)local_f8);
      dynamic::basic_variable<std::allocator<char>_>::basic_variable
                ((basic_variable<std::allocator<char>_> *)&value.second.storage.field_0x28,pbVar4);
      std::
      make_pair<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>>
                ((pair<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  *)local_1d8,(basic_variable<std::allocator<char>_> *)&val.storage.field_0x28,
                 (basic_variable<std::allocator<char>_> *)&value.second.storage.field_0x28);
      bintoken::oarchive::save_override<trial::dynamic::basic_variable<std::allocator<char>>>
                ((oarchive *)data_local,(basic_variable<std::allocator<char>_> *)local_1d8,
                 (ulong)local_1c);
      bintoken::oarchive::save_override<trial::dynamic::basic_variable<std::allocator<char>>>
                ((oarchive *)data_local,
                 (basic_variable<std::allocator<char>_> *)&value.first.storage.field_0x28,
                 (ulong)local_1c);
      std::
      pair<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::~pair((pair<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_1d8);
      dynamic::basic_variable<std::allocator<char>_>::~basic_variable
                ((basic_variable<std::allocator<char>_> *)&value.second.storage.field_0x28);
      dynamic::basic_variable<std::allocator<char>_>::~basic_variable
                ((basic_variable<std::allocator<char>_> *)&val.storage.field_0x28);
      dynamic::basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::operator++((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                    *)local_f8);
    }
    dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
              ((const_iterator *)local_f8);
    bintoken::oarchive::save<trial::protocol::bintoken::token::end_assoc_array>
              ((oarchive *)data_local);
  }
  return;
}

Assistant:

static void save(protocol::bintoken::oarchive& ar,
                     const dynamic::variable& data,
                     const unsigned int protocol_version)
    {
        switch (data.code())
        {
        case dynamic::code::null:
            ar.template save<bintoken::token::null>();
            break;

        case dynamic::code::boolean:
            ar.save(data.value<bool>());
            break;

        case dynamic::code::signed_char:
            ar.save(data.value<signed char>());
            break;

        case dynamic::code::unsigned_char:
            ar.save(data.value<unsigned char>());
            break;

        case dynamic::code::signed_short_integer:
            ar.save(data.value<signed short int>());
            break;

        case dynamic::code::unsigned_short_integer:
            ar.save(data.value<unsigned short int>());
            break;

        case dynamic::code::signed_integer:
            ar.save(data.value<signed int>());
            break;

        case dynamic::code::unsigned_integer:
            ar.save(data.value<unsigned int>());
            break;

        case dynamic::code::signed_long_integer:
            ar.save(data.value<signed long int>());
            break;

        case dynamic::code::unsigned_long_integer:
            ar.save(data.value<unsigned long int>());
            break;

        case dynamic::code::signed_long_long_integer:
            ar.save(data.value<signed long long int>());
            break;

        case dynamic::code::unsigned_long_long_integer:
            ar.save(data.value<unsigned long long int>());
            break;

        case dynamic::code::real:
            ar.save(data.value<float>());
            break;

        case dynamic::code::long_real:
            ar.save(data.value<double>());
            break;

        case dynamic::code::long_long_real:
            // Format only supports 64-bit floats
            ar.save(data.value<double>());
            break;

        case dynamic::code::string:
            ar.save(data.value<dynamic::string>());
            break;

        case dynamic::code::wstring:
        case dynamic::code::u16string:
        case dynamic::code::u32string:
            throw bintoken::error(bintoken::incompatible_type);

        case dynamic::code::array:
            ar.template save<bintoken::token::begin_array>();
            ar.template save<std::size_t>(data.size());
            for (const auto& item : data)
            {
                ar.save_override(item, protocol_version);
            }
            ar.template save<bintoken::token::end_array>();
            break;

        case dynamic::code::map:
            ar.template save<bintoken::token::begin_assoc_array>();
            ar.template save<bintoken::token::null>();
            for (auto it = data.begin(); it != data.end(); ++it)
            {
                auto key = it.key();
                auto val = it.value();
                auto value = std::make_pair(std::move(key), std::move(val));
                ar.save_override(value.first, protocol_version);
                ar.save_override(value.second, protocol_version);
            }
            ar.template save<bintoken::token::end_assoc_array>();
            break;
        }
    }